

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::jsr(Code *this,Param *target)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  uint16_t local_1a;
  Param *pPStack_18;
  uint16_t opcode;
  Param *target_local;
  Code *this_local;
  
  pPStack_18 = target;
  target_local = (Param *)this;
  local_1a = Param::getMXn(target);
  local_1a = local_1a + 0x4e80;
  add_opcode(this,local_1a);
  (*pPStack_18->_vptr_Param[2])();
  add_bytes(this,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return this;
}

Assistant:

Code& Code::jsr(const Param& target)
{
    uint16_t opcode = 0x4E80 + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(target.getAdditionnalData());
    return *this;
}